

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O1

VectorXd __thiscall mnf::Point::pseudoLog(Point *this,Point *y)

{
  Manifold *this_00;
  double *size;
  _func_int **pp_Var1;
  long in_RDX;
  Index extraout_RDX;
  Index outer_stride;
  VectorXd VVar2;
  ConstRefVec local_a8;
  _func_int **local_78;
  double *pdStack_70;
  ConstRefVec local_58;
  
  size = (double *)Manifold::tangentDim((y->super_SubPoint).super_ConstSubPoint.manifold_);
  this->_vptr_Point = (_func_int **)0x0;
  (this->super_PointMemory).mem_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  if ((long)size < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if ((this->super_PointMemory).mem_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data != size) {
    free(this->_vptr_Point);
    if (size == (double *)0x0) {
      pp_Var1 = (_func_int **)0x0;
    }
    else {
      pp_Var1 = (_func_int **)
                Eigen::internal::conditional_aligned_new_auto<double,true>((size_t)size);
    }
    this->_vptr_Point = pp_Var1;
  }
  (this->super_PointMemory).mem_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = size;
  this_00 = (y->super_SubPoint).super_ConstSubPoint.manifold_;
  local_78 = this->_vptr_Point;
  local_a8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  local_a8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  local_a8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_data = *(PointerType *)
             &(y->super_SubPoint).super_ConstSubPoint.value_.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  ;
  local_a8.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_rows.m_value =
       *(long *)&(y->super_SubPoint).super_ConstSubPoint.value_.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 .field_0x8;
  pdStack_70 = size;
  if (-1 < local_a8.
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           .
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_rows.m_value ||
      local_a8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_data == (PointerType)0x0) {
    ConstSubPoint::value(&local_58,(ConstSubPoint *)(in_RDX + 0x18));
    Manifold::pseudoLog(this_00,(RefVec *)&local_78,&local_a8,&local_58);
    free(local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    free(local_a8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (VectorXd)VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

Eigen::VectorXd Point::pseudoLog(const Point& y) const
{
  Eigen::VectorXd out(manifold_.tangentDim());
  manifold_.pseudoLog(out, this->value_, y.value());
  return out;
}